

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int xmlwrite_heap(archive_write *a,xml_writer *writer,heap_data *heap)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *attrvalue;
  
  iVar1 = xmlwrite_fstring(a,writer,"length","%ju",heap->length);
  uVar3 = 0xffffffe2;
  if (-1 < iVar1) {
    iVar1 = xmlwrite_fstring(a,writer,"offset","%ju",heap->temp_offset);
    if (-1 < iVar1) {
      iVar1 = xmlwrite_fstring(a,writer,"size","%ju",heap->size);
      if (-1 < iVar1) {
        uVar2 = heap->compression - GZIP;
        if (uVar2 < 4) {
          attrvalue = &DAT_001913b4 + *(int *)(&DAT_001913b4 + (ulong)uVar2 * 4);
        }
        else {
          attrvalue = "application/octet-stream";
        }
        iVar1 = xmlwrite_string_attr(a,writer,"encoding",(char *)0x0,"style",attrvalue);
        if (-1 < iVar1) {
          iVar1 = xmlwrite_sum(a,writer,"archived-checksum",&heap->a_sum);
          if (-1 < iVar1) {
            iVar1 = xmlwrite_sum(a,writer,"extracted-checksum",&heap->e_sum);
            uVar3 = iVar1 >> 0x1f & 0xffffffe2;
          }
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static int
xmlwrite_heap(struct archive_write *a, struct xml_writer *writer,
	struct heap_data *heap)
{
	const char *encname;
	int r;

	r = xmlwrite_fstring(a, writer, "length", "%ju", heap->length);
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = xmlwrite_fstring(a, writer, "offset", "%ju", heap->temp_offset);
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = xmlwrite_fstring(a, writer, "size", "%ju", heap->size);
	if (r < 0)
		return (ARCHIVE_FATAL);
	switch (heap->compression) {
	case GZIP:
		encname = "application/x-gzip"; break;
	case BZIP2:
		encname = "application/x-bzip2"; break;
	case LZMA:
		encname = "application/x-lzma"; break;
	case XZ:
		encname = "application/x-xz"; break;
	default:
		encname = "application/octet-stream"; break;
	}
	r = xmlwrite_string_attr(a, writer, "encoding", NULL,
	    "style", encname);
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = xmlwrite_sum(a, writer, "archived-checksum", &(heap->a_sum));
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = xmlwrite_sum(a, writer, "extracted-checksum", &(heap->e_sum));
	if (r < 0)
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}